

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromMeshDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,double normalized_mesh_density)

{
  double dVar1;
  uint local_14;
  uint subd_display_density;
  double normalized_mesh_density_local;
  
  dVar1 = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);
  if ((dVar1 < 0.0) || (1.0 < dVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xf7f,"","Invalid normalized_mesh_density parameter.");
    memcpy(__return_storage_ptr__,&Default,0x40);
  }
  else {
    if (2.3283064365386963e-10 < dVar1) {
      if (0.2 <= dVar1) {
        if (0.35 <= dVar1) {
          if (0.75 < dVar1) {
            if (0.9999999997671694 <= dVar1) {
              if (1.0000000002328306 < dVar1) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                           ,0xf78,"","Bug in some if condition in this function.");
                local_14 = 4;
              }
              else {
                local_14 = 5;
              }
            }
            else {
              local_14 = 5;
            }
          }
          else {
            local_14 = 4;
          }
        }
        else {
          local_14 = 3;
        }
      }
      else {
        local_14 = 2;
      }
    }
    else {
      local_14 = 1;
    }
    CreateFromDisplayDensity(__return_storage_ptr__,local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromMeshDensity(
  double normalized_mesh_density
)
{
  normalized_mesh_density = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);

  if (normalized_mesh_density >= 0.0 && normalized_mesh_density <= 1.0)
  {
    unsigned int subd_display_density;

    if (normalized_mesh_density <= ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraCoarseDensity;
    else if (normalized_mesh_density < 0.20)
      subd_display_density = ON_SubDDisplayParameters::CoarseDensity;
    else if (normalized_mesh_density < 0.35)
      subd_display_density = ON_SubDDisplayParameters::MediumDensity;
    else if (normalized_mesh_density <= 0.75)
      subd_display_density = ON_SubDDisplayParameters::FineDensity;
    else if (normalized_mesh_density < 1.0 - ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else if (normalized_mesh_density <= 1.0 + ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else
    {
      ON_ERROR("Bug in some if condition in this function.");
      subd_display_density = ON_SubDDisplayParameters::DefaultDensity;
    }

    return ON_SubDDisplayParameters::CreateFromDisplayDensity(subd_display_density);
  }

  ON_ERROR("Invalid normalized_mesh_density parameter.");
  return ON_SubDDisplayParameters::Default;
}